

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::ExeName::ExeName(ExeName *this,string *ref)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<Catch::clara::detail::BoundValueRefBase> *in_stack_ffffffffffffffd0;
  ExeName *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  
  __args = in_RDI;
  ExeName(in_stack_ffffffffffffffe0);
  ::std::
  make_shared<Catch::clara::detail::BoundValueRef<std::__cxx11::string>,std::__cxx11::string&>
            (__args);
  ::std::shared_ptr<Catch::clara::detail::BoundValueRefBase>::operator=
            (in_stack_ffffffffffffffd0,
             (shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
  std::
  shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<Catch::clara::detail::BoundValueRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x1626c9);
  return;
}

Assistant:

explicit ExeName( std::string &ref ) : ExeName() {
            m_ref = std::make_shared<BoundValueRef<std::string>>( ref );
        }